

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexfloat.c
# Opt level: O0

void ff_cast(flexfloat_t *obj,flexfloat_t *source,flexfloat_desc_t desc)

{
  undefined2 in_DX;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  flexfloat_t *in_stack_00000030;
  char local_2;
  char cStack_1;
  
  *in_RDI = *in_RSI;
  *(undefined2 *)(in_RDI + 1) = in_DX;
  local_2 = (char)in_DX;
  if ((local_2 != *(char *)(in_RSI + 1)) ||
     (cStack_1 = (char)((ushort)in_DX >> 8), cStack_1 != *(char *)((long)in_RSI + 9))) {
    flexfloat_sanitize(in_stack_00000030);
  }
  return;
}

Assistant:

INLINE void ff_cast(flexfloat_t *obj, const flexfloat_t *source, flexfloat_desc_t desc ) {
    obj->value = source->value;
    #ifdef FLEXFLOAT_TRACKING
    obj->exact_value = source->exact_value;
    obj->tracking_fn = 0;
    obj->tracking_arg = 0;
    #endif
    obj->desc  = desc;
    if(desc.exp_bits != source->desc.exp_bits || desc.frac_bits != source->desc.frac_bits)
        flexfloat_sanitize(obj);
    #ifdef FLEXFLOAT_STATS
    if(StatsEnabled) getCastStats(source->desc, desc)->total += 1;
    #endif
}